

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void __thiscall
pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
opt<pstore::command_line::details::one_or_more>
          (opt<int,_pstore::command_line::parser<int,_void>_> *this,one_or_more *mods)

{
  one_or_more *mods_local;
  opt<int,_pstore::command_line::parser<int,_void>_> *this_local;
  
  option::option(&this->super_option);
  (this->super_option)._vptr_option = (_func_int **)&PTR__opt_00244b50;
  this->value_ = 0;
  parser<int,_void>::parser(&this->parser_);
  apply_to_option<pstore::command_line::opt<int,pstore::command_line::parser<int,void>>&,pstore::command_line::details::one_or_more_const&>
            (this,mods);
  return;
}

Assistant:

explicit opt (Mods const &... mods)
                    : option () {
                apply_to_option (*this, mods...);
            }